

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSRGBDecodeTests.cpp
# Opt level: O2

bool __thiscall
deqp::gles31::Functional::anon_unknown_0::DecodeMultipleTexturesCase::verifyResult
          (DecodeMultipleTexturesCase *this)

{
  TestLog *pTVar1;
  bool bVar2;
  allocator<char> local_239;
  allocator<char> local_238 [32];
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> pixelResultList;
  Vec4 pixelExpected1;
  Vec4 pixelExpected0;
  Vector<float,_4> local_1b8;
  Vector<float,_4> local_1a8;
  undefined1 local_198 [8];
  TestContext *pTStack_190;
  
  pTVar1 = ((this->super_SRGBTestCase).super_TestCase.m_context)->m_testCtx->m_log;
  pixelResultList.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  pixelResultList.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pixelResultList.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  tcu::Vector<float,_4>::Vector(&pixelExpected0);
  tcu::Vector<float,_4>::Vector(&pixelExpected1);
  SRGBTestCase::readResultTextures(&this->super_SRGBTestCase);
  SRGBTestCase::storeResultPixels(&this->super_SRGBTestCase,&pixelResultList);
  getColorReferenceSRGB();
  SRGBTestCase::formatReferenceColor((SRGBTestCase *)local_198,(Vec4 *)this);
  pixelExpected0.m_data[0] = (float)local_198._0_4_;
  pixelExpected0.m_data[1] = (float)local_198._4_4_;
  pixelExpected0.m_data._8_8_ = pTStack_190;
  SRGBTestCase::formatReferenceColor((SRGBTestCase *)local_198,(Vec4 *)this);
  pixelExpected1.m_data[0] = (float)local_198._0_4_;
  pixelExpected1.m_data[1] = (float)local_198._4_4_;
  pixelExpected1.m_data._8_8_ = pTStack_190;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_198,"Expected color: ",local_238);
  tcu::Vector<float,_4>::Vector(&local_1a8,&pixelExpected0);
  SRGBTestCase::logColor(&this->super_SRGBTestCase,(string *)local_198,0,&local_1a8);
  std::__cxx11::string::~string((string *)local_198);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_198,"Expected color: ",local_238);
  tcu::Vector<float,_4>::Vector(&local_1b8,&pixelExpected1);
  SRGBTestCase::logColor(&this->super_SRGBTestCase,(string *)local_198,1,&local_1b8);
  std::__cxx11::string::~string((string *)local_198);
  tcu::equal<float,4>((tcu *)local_198,
                      pixelResultList.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      pixelResultList.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + 1);
  bVar2 = tcu::boolAll<4>((Vector<bool,_4> *)local_198);
  local_198 = (undefined1  [8])pTVar1;
  if (bVar2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pTStack_190);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_238,"texel values are equal",&local_239);
    std::operator<<((ostream *)&pTStack_190,(string *)local_238);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pTStack_190);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_238,"texel values are different",&local_239);
    std::operator<<((ostream *)&pTStack_190,(string *)local_238);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::string::~string((string *)local_238);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pTStack_190);
  std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
            (&pixelResultList.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>);
  return !bVar2;
}

Assistant:

bool DecodeMultipleTexturesCase::verifyResult (void)
{
	tcu::TestLog&			log				= m_context.getTestContext().getLog();
	const int				resultColorIdx	= 0;
	std::vector<tcu::Vec4>	pixelResultList;
	tcu::Vec4				pixelExpected0;
	tcu::Vec4				pixelExpected1;

	this->readResultTextures();
	this->storeResultPixels(pixelResultList);

	pixelExpected0 = this->formatReferenceColor(getColorReferenceSRGB());
	pixelExpected1 = this->formatReferenceColor(getColorReferenceLinear());

	this->logColor(std::string("Expected color: "), resultColorIdx, pixelExpected0);
	this->logColor(std::string("Expected color: "), resultColorIdx +1, pixelExpected1);

	//	check if the two textures have different values i.e. uTexture0 = sRGB and uTexture1 = linear
	if ( !(tcu::boolAll(tcu::equal(pixelResultList[resultColorIdx], pixelResultList[resultColorIdx +1]))) )
	{
		log << tcu::TestLog::Message << std::string("texel values are different") << tcu::TestLog::EndMessage;
		return true;
	}
	else
	{
		log << tcu::TestLog::Message << std::string("texel values are equal") << tcu::TestLog::EndMessage;
		return false;
	}
}